

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O3

void __thiscall TestCase::TestPassed(TestCase *this)

{
  Mutex::Lock();
  if (this->mTestComplete == true) {
    if (this->mTestPassed == true) {
      puts(" BAD TEST CASE, TestPassed called twice");
    }
    this->mTestPassed = false;
  }
  else {
    this->mTestComplete = true;
    this->mTestPassed = true;
  }
  Mutex::Unlock();
  return;
}

Assistant:

void TestPassed()
	{
		mMutex.Lock();
		
		if ( mTestComplete )
		{
			if ( mTestPassed )
				printf( " BAD TEST CASE, TestPassed called twice\n" );

			mTestPassed = false;
		}
		else
		{
			mTestComplete = true;
			mTestPassed = true;
		}
		mMutex.Unlock();
	}